

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

Duration * google::protobuf::operator*=(Duration *d,double r)

{
  void *pvVar1;
  long seconds;
  double dVar2;
  Duration local_38;
  
  dVar2 = ((double)d->nanos_ / 1000000000.0 + (double)d->seconds_) * r;
  seconds = (long)dVar2;
  util::anon_unknown_1::CreateNormalized<google::protobuf::Duration>
            (&local_38,seconds,(long)(int)((dVar2 - (double)seconds) * 1000000000.0));
  pvVar1 = (d->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if (((ulong)local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(void **)((ulong)local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                   0xfffffffffffffffe);
  }
  if (pvVar1 == local_38.super_Message.super_MessageLite._internal_metadata_.ptr_) {
    if (&local_38 != d) {
      Duration::InternalSwap(d,&local_38);
    }
  }
  else {
    Duration::CopyFrom(d,&local_38);
  }
  Duration::~Duration(&local_38);
  return d;
}

Assistant:

Duration& operator*=(Duration& d, double r) {  // NOLINT
  double result = (d.seconds() * 1.0 + 1.0 * d.nanos() / kNanosPerSecond) * r;
  int64 seconds = static_cast<int64>(result);
  int32 nanos = static_cast<int32>((result - seconds) * kNanosPerSecond);
  // Note that we normalize here not just because nanos can have a different
  // sign from seconds but also that nanos can be any arbitrary value when
  // overflow happens (i.e., the result is a much larger value than what
  // int64 can represent).
  d = CreateNormalized<Duration>(seconds, nanos);
  return d;
}